

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::CompactReporter::testRunEnded(CompactReporter *this,TestRunStats *_testRunStats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t sVar3;
  _anonymous_namespace_ *this_00;
  ostream *poVar4;
  size_t sVar5;
  size_t count;
  size_t count_00;
  size_t count_01;
  size_t count_02;
  long in_FS_OFFSET;
  Colour colour_2;
  Colour colour;
  Colour colour_1;
  string qualify_assertions_failed;
  char local_10a [2];
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined2 local_f0;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  char local_d8 [8];
  char local_d0 [16];
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined2 local_a8;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  char local_88 [16];
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  poVar4 = (this->super_StreamingReporterBase<Catch::CompactReporter>).stream;
  sVar3 = (_testRunStats->totals).testCases.failed;
  sVar5 = (_testRunStats->totals).testCases.passed + sVar3 +
          (_testRunStats->totals).testCases.failedButOk;
  if (sVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"No tests ran.",0xd);
  }
  else if (sVar3 == sVar5) {
    local_10a[1] = 0;
    Colour::use(BrightRed);
    this_00 = (_anonymous_namespace_ *)(_testRunStats->totals).assertions.failed;
    if (this_00 ==
        this_00 + (_testRunStats->totals).assertions.failedButOk +
                  (_testRunStats->totals).assertions.passed) {
      ::(anonymous_namespace)::bothOrAll_abi_cxx11_(&local_58,this_00,count);
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity =
           local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Failed ",7);
    ::(anonymous_namespace)::bothOrAll_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)(_testRunStats->totals).testCases.failed,count_01)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_78._M_dataplus._M_p,local_78._M_string_length);
    local_a0 = (undefined1  [8])(_testRunStats->totals).testCases.failed;
    local_b0 = 0x7361632074736574;
    local_a8 = 0x65;
    local_b8 = 9;
    local_98._M_p = local_88;
    local_c0 = &local_b0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_98,&local_b0,(long)&local_a8 + 1);
    operator<<(poVar4,(pluralise *)local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", failed ",9);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_58._M_dataplus._M_p,local_58._M_string_length);
    local_e8 = (undefined1  [8])(_testRunStats->totals).assertions.failed;
    local_f8 = 0x6f69747265737361;
    local_f0 = 0x6e;
    local_100 = 9;
    local_108 = &local_f8;
    local_e0._M_p = local_d0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_e0,&local_f8,(long)&local_f0 + 1);
    operator<<(poVar4,(pluralise *)local_e8);
    local_10a[0] = '.';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_10a,1);
    if (local_e0._M_p != local_d0) {
      operator_delete(local_e0._M_p);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_98._M_p != local_88) {
      operator_delete(local_98._M_p);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    Colour::use(None);
  }
  else {
    sVar3 = (_testRunStats->totals).assertions.failed;
    if ((_testRunStats->totals).assertions.passed + sVar3 +
        (_testRunStats->totals).assertions.failedButOk == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Passed ",7);
      ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                ((string *)local_e8,
                 (_anonymous_namespace_ *)
                 ((_testRunStats->totals).testCases.failed +
                  (_testRunStats->totals).testCases.passed +
                 (_testRunStats->totals).testCases.failedButOk),count_00);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_e8,(long)local_e0._M_p);
      local_a0 = (undefined1  [8])
                 ((_testRunStats->totals).testCases.failed +
                  (_testRunStats->totals).testCases.passed +
                 (_testRunStats->totals).testCases.failedButOk);
      paVar1 = &local_58.field_2;
      local_58.field_2._M_allocated_capacity = 0x7361632074736574;
      local_58.field_2._8_2_ = 0x65;
      local_58._M_string_length = 9;
      local_98._M_p = local_88;
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,paVar1,(undefined1 *)((long)&local_58.field_2 + 9));
      operator<<(poVar4,(pluralise *)local_a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," (no assertions).",0x11);
      if (local_98._M_p != local_88) {
        operator_delete(local_98._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if (local_e8 != (undefined1  [8])local_d8) {
        operator_delete((void *)local_e8);
      }
    }
    else if (sVar3 == 0) {
      local_10a[0] = '\0';
      Colour::use(BrightGreen);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Passed ",7);
      ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                (&local_58,(_anonymous_namespace_ *)(_testRunStats->totals).testCases.passed,
                 count_02);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_58._M_dataplus._M_p,local_58._M_string_length);
      local_a0 = (undefined1  [8])(_testRunStats->totals).testCases.passed;
      paVar1 = &local_78.field_2;
      local_78.field_2._M_allocated_capacity = 0x7361632074736574;
      local_78.field_2._8_2_ = 0x65;
      local_78._M_string_length = 9;
      local_98._M_p = local_88;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,paVar1,(undefined1 *)((long)&local_78.field_2 + 9));
      operator<<(poVar4,(pluralise *)local_a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," with ",6);
      local_e8 = (undefined1  [8])(_testRunStats->totals).assertions.passed;
      local_b0 = 0x6f69747265737361;
      local_a8 = 0x6e;
      local_b8 = 9;
      local_e0._M_p = local_d0;
      local_c0 = &local_b0;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e0,&local_b0,(long)&local_a8 + 1);
      operator<<(poVar4,(pluralise *)local_e8);
      local_108 = (undefined8 *)CONCAT71(local_108._1_7_,0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_108,1);
      if (local_e0._M_p != local_d0) {
        operator_delete(local_e0._M_p);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0);
      }
      if (local_98._M_p != local_88) {
        operator_delete(local_98._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      Colour::use(None);
    }
    else {
      local_108 = (undefined8 *)((ulong)local_108 & 0xffffffffffffff00);
      Colour::use(BrightRed);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Failed ",7);
      local_a0 = (undefined1  [8])(_testRunStats->totals).testCases.failed;
      paVar1 = &local_58.field_2;
      local_58.field_2._M_allocated_capacity = 0x7361632074736574;
      local_58.field_2._8_2_ = 0x65;
      local_58._M_string_length = 9;
      local_98._M_p = local_88;
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,paVar1,(undefined1 *)((long)&local_58.field_2 + 9));
      operator<<(poVar4,(pluralise *)local_a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", failed ",9);
      local_e8 = (undefined1  [8])(_testRunStats->totals).assertions.failed;
      paVar2 = &local_78.field_2;
      local_78.field_2._M_allocated_capacity = 0x6f69747265737361;
      local_78.field_2._8_2_ = 0x6e;
      local_78._M_string_length = 9;
      local_e0._M_p = local_d0;
      local_78._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,paVar2,(undefined1 *)((long)&local_78.field_2 + 9));
      operator<<(poVar4,(pluralise *)local_e8);
      local_c0 = (undefined8 *)CONCAT71(local_c0._1_7_,0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_c0,1);
      if (local_e0._M_p != local_d0) {
        operator_delete(local_e0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if (local_98._M_p != local_88) {
        operator_delete(local_98._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      Colour::use(None);
    }
  }
  local_a0[0] = 10;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase<Catch::CompactReporter>).stream,local_a0,1)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  StreamingReporterBase<Catch::CompactReporter>::testRunEnded
            (&this->super_StreamingReporterBase<Catch::CompactReporter>,_testRunStats);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CompactReporter::testRunEnded( TestRunStats const& _testRunStats ) {
            printTotals( stream, _testRunStats.totals );
            stream << '\n' << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }